

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosinski-compress.c
# Opt level: O3

void FlushData(KosinskiCompressCallbacks *callbacks)

{
  long lVar1;
  ulong uVar2;
  
  descriptor = descriptor >> ((byte)descriptor_bits_remaining & 0x1f);
  (*callbacks->write_byte)(callbacks->write_byte_user_data,descriptor & 0xff);
  (*callbacks->write_byte)(callbacks->write_byte_user_data,descriptor >> 8 & 0xff);
  if (match_buffer_index == 0) {
    lVar1 = 2;
  }
  else {
    uVar2 = 0;
    do {
      (*callbacks->write_byte)(callbacks->write_byte_user_data,(uint)match_buffer[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < match_buffer_index);
    lVar1 = match_buffer_index + 2;
  }
  output_position = output_position + lVar1;
  return;
}

Assistant:

static void FlushData(const KosinskiCompressCallbacks* const callbacks)
{
	size_t i;

	descriptor >>= descriptor_bits_remaining;

	/* Descriptors are stored byte-swapped, so it's possible that the original
	   compressor was designed for a little-endian CPU and that it did this:
	   fwrite(&descriptor, 2, 1, output_file); */
	for (i = 0; i < TOTAL_DESCRIPTOR_BITS / 8; ++i)
		callbacks->write_byte((void*)callbacks->write_byte_user_data, (descriptor >> (i * 8)) & 0xFF);

	for (i = 0; i < match_buffer_index; ++i)
		callbacks->write_byte((void*)callbacks->write_byte_user_data, match_buffer[i]);

	output_position += TOTAL_DESCRIPTOR_BITS / 8 + match_buffer_index;
}